

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O2

void __thiscall
drace::detector::Fasttrack<std::shared_mutex>::happens_before
          (Fasttrack<std::shared_mutex> *this,tls_t tls,void *identifier)

{
  iterator it;
  void *local_90;
  iterator local_88;
  iterator local_50;
  
  local_90 = identifier;
  std::__shared_mutex_pthread::lock(&(this->g_lock)._M_impl);
  phmap::container_internal::
  parallel_hash_set<4ul,phmap::container_internal::raw_hash_set,phmap::NullMutex,phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
  ::find<void*>(&local_88,&this->happens_states,&local_90);
  if (local_88.inner_ == (Inner *)0x0) {
    create_happens(&local_50,this,local_90);
    local_88.it_end_.ctrl_ = local_50.it_end_.ctrl_;
    local_88.it_end_.field_1 = local_50.it_end_.field_1;
    local_88.it_.ctrl_ = local_50.it_.ctrl_;
    local_88.it_.field_1 = local_50.it_.field_1;
    local_88.inner_ = local_50.inner_;
    local_88.inner_end_ = local_50.inner_end_;
  }
  ThreadState::inc_vc((ThreadState *)tls);
  VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::update
            ((VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *)
             ((long)local_88.it_.field_1.slot_ + 8),
             (TID)((ulong)*(undefined8 *)((long)tls + 0x30) >> 0x20),*(VC_ID *)((long)tls + 0x30));
  pthread_rwlock_unlock((pthread_rwlock_t *)&this->g_lock);
  return;
}

Assistant:

void happens_before(tls_t tls, void* identifier) final {
    std::lock_guard<LockT> exLockT(g_lock);
    auto it = happens_states.find(identifier);
    if (it == happens_states.end()) {
      it = create_happens(identifier);
    }

    ThreadState* thr = reinterpret_cast<ThreadState*>(tls);

    thr->inc_vc();  // increment clock of thread and update happens state
    it->second.update(thr->get_tid(), thr->return_own_id());
  }